

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_EnergyScan_Test::TestBody(InterpreterTestSuite_PC_EnergyScan_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  element_type *this_01;
  MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_02;
  TypedExpectation<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_03;
  char *message;
  Matcher<unsigned_short> *gmock_a3;
  string local_3d8;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_;
  allocator local_341;
  string local_340;
  Expression local_320;
  undefined1 local_308 [8];
  Value value;
  Expression expr;
  ReturnAction<ot::commissioner::Error> local_280;
  Action<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_270;
  WithoutMatchers local_249;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_248;
  Matcher<unsigned_short> local_230;
  Matcher<unsigned_short> local_218;
  Matcher<unsigned_char> local_200;
  Matcher<unsigned_int> local_1e8;
  MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1d0;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_EnergyScan_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  this_01 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_1e8,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_200,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_218,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_230,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_248,(AnythingMatcher *)&testing::_);
  gmock_a3 = &local_230;
  CommissionerAppMock::gmock_EnergyScan
            (&local_1d0,this_01,&local_1e8,&local_200,&local_218,gmock_a3,&local_248);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_1d0,&local_249,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x85a,"*ctx.mDefaultCommissionerObject","EnergyScan(_, _, _, _, _)");
  ot::commissioner::Error::Error
            ((Error *)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::Return<ot::commissioner::Error>
            ((testing *)&local_280,
             (Error *)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_270,(ReturnAction *)&local_280);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(this_03,&local_270);
  testing::
  Action<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~Action(&local_270);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_280);
  ot::commissioner::Error::~Error
            ((Error *)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::
  MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_1d0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_248);
  testing::Matcher<unsigned_short>::~Matcher(&local_230);
  testing::Matcher<unsigned_short>::~Matcher(&local_218);
  testing::Matcher<unsigned_char>::~Matcher(&local_200);
  testing::Matcher<unsigned_int>::~Matcher(&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"energy scan 1 2 3 4 1234::5678",&local_341);
  ot::commissioner::Interpreter::ParseExpression(&local_320,(Interpreter *)local_140,&local_340);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,&local_320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_308,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_3a1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_308);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3d8,(internal *)local_3a0,(AssertionResult *)0x46a487,"false","true",
               (char *)gmock_a3);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x861,message);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_EnergyScan)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, EnergyScan(_, _, _, _, _)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("energy scan 1 2 3 4 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}